

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
               (void)

{
  Dimension *pDVar1;
  Dimension DVar2;
  Dimension local_a00 [2];
  undefined **local_9f8;
  undefined1 local_9f0;
  undefined8 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mm;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mr;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mb;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mc1;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mc2;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>>
            ();
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::Matrix(&m,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mb);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x15f);
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  mr.colSettings_ =
       (Column_settings *)
       CONCAT44(mr.colSettings_._4_4_,(undefined4)m.matrix_.matrix_._M_h._M_element_count);
  mc1.colSettings_ = (Column_settings *)((ulong)mc1.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mb,&local_260,0x15f,1,2,&mr,"m.get_number_of_columns()",&mc1,"0");
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>
              *)&mb,&ordered_boundaries,(function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,5);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x163);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  mc1.colSettings_ =
       (Column_settings *)
       CONCAT44(mc1.colSettings_._4_4_,(Dimension)mb.matrix_.matrix_._M_h._M_element_count);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mr,&local_290,0x163,1,2,&mc1,"mb.get_number_of_columns()",&mc2,"7");
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x164);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_940 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
          ::get_column_dimension(&mb.matrix_,2);
  mc1.colSettings_ = (Column_settings *)CONCAT44(mc1.colSettings_._4_4_,DVar2);
  mc2.colSettings_ = (Column_settings *)((ulong)mc2.colSettings_ & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_948,0x164,1,2,&mc1,"mb.get_column_dimension(2)",&mc2,"0");
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x165);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_958 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_950 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
          ::get_column_dimension(&mb.matrix_,6);
  mc1.colSettings_ = (Column_settings *)CONCAT44(mc1.colSettings_._4_4_,DVar2);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_958,0x165,1,2,&mc1,"mb.get_column_dimension(6)",&mc2,"2");
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::Matrix(&mr,5,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mc2,0xffffffff);
  std::_Function_base::~_Function_base((_Function_base *)&mc2);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x169);
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT44(mc2.colSettings_._4_4_,(undefined4)mr.matrix_.matrix_._M_h._M_element_count);
  mm.colSettings_ = (Column_settings *)((ulong)mm.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mc1,&local_300,0x169,1,2,&mc2,"mr.get_number_of_columns()",&mm,"0");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::Matrix(&mc1,&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::Matrix(&mc2,&mb);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x16e);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_a00[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_430,0x16e,1,2,&local_9f8,"mc1.get_number_of_columns()",local_a00,"7");
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x16f);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_960 = "";
  local_9f8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
       ::get_column_dimension(&mc1.matrix_,2);
  local_a00[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_968,0x16f,1,2,&local_9f8,"mc1.get_column_dimension(2)",local_a00,"0");
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x170);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_970 = "";
  local_9f8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
       ::get_column_dimension(&mc1.matrix_,6);
  local_a00[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_978,0x170,1,2,&local_9f8,"mc1.get_column_dimension(6)",local_a00,"2");
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x171);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_a00[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_4a0,0x171,1,2,&local_9f8,"mc2.get_number_of_columns()",local_a00,"7");
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4b0,0x172);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_9f8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
       ::get_column_dimension(&mc2.matrix_,2);
  local_a00[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_988,0x172,1,2,&local_9f8,"mc2.get_column_dimension(2)",local_a00,"0");
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x173);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_998 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_990 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
          ::get_column_dimension(&mc2.matrix_,6);
  local_9f8 = (undefined **)CONCAT44(local_9f8._4_4_,DVar2);
  local_a00[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_998,0x173,1,2,&local_9f8,"mc2.get_column_dimension(6)",local_a00,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::Matrix(&mm,&mb);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x177);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_508 = "";
  local_a00[0] = (Dimension)mm.matrix_.matrix_._M_h._M_element_count;
  pDVar1 = local_a00 + 1;
  local_a00[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_9f8,&local_510,0x177,1,2,local_a00,"mm.get_number_of_columns()",pDVar1,"7");
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x178);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_9a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_9a0 = "";
  local_a00[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                 ::get_column_dimension(&mm.matrix_,2);
  local_a00[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_9f8,&local_9a8,0x178,1,2,local_a00,"mm.get_column_dimension(2)",pDVar1,"0");
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x179);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_9b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_9b0 = "";
  local_a00[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                 ::get_column_dimension(&mm.matrix_,6);
  local_a00[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_9f8,&local_9b8,0x179,1,2,local_a00,"mm.get_column_dimension(6)",pDVar1,"2");
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_560,0x17a);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_578 = "";
  local_a00[0] = (Dimension)mb.matrix_.matrix_._M_h._M_element_count;
  local_a00[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_9f8,&local_580,0x17a,1,2,local_a00,"mb.get_number_of_columns()",pDVar1,"0");
  Gudhi::persistence_matrix::swap(&mm,&mb);
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_590,0x17e);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_a00[0] = (Dimension)mm.matrix_.matrix_._M_h._M_element_count;
  local_a00[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_9f8,&local_5b0,0x17e,1,2,local_a00,"mm.get_number_of_columns()",pDVar1,"0");
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5c0,0x17f);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5d8 = "";
  local_a00[0] = (Dimension)mb.matrix_.matrix_._M_h._M_element_count;
  local_a00[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_9f8,&local_5e0,0x17f,1,2,local_a00,"mb.get_number_of_columns()",pDVar1,"7");
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5f0,0x180);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_9c0 = "";
  local_a00[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                 ::get_column_dimension(&mb.matrix_,2);
  local_a00[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_9f8,&local_9c8,0x180,1,2,local_a00,"mb.get_column_dimension(2)",pDVar1,"0");
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_608 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_610,0x181);
  local_9f0 = 0;
  local_9f8 = &PTR__lazy_ostream_001e9068;
  local_9e8 = &boost::unit_test::lazy_ostream::inst;
  local_9e0 = "";
  local_9d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_9d0 = "";
  local_a00[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                 ::get_column_dimension(&mb.matrix_,6);
  local_a00[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_9f8,&local_9d8,0x181,1,2,local_a00,"mb.get_column_dimension(6)",pDVar1,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&mm);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&mc2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&mc1);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&mr);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}